

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O2

int Gia_ManLutLevelWithBoxes(Gia_Man_t *p)

{
  Tim_Man_t *p_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  float *pfVar8;
  Gia_Obj_t *pObj;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  float *pfVar15;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x24b,"int Gia_ManLutLevelWithBoxes(Gia_Man_t *)");
  }
  p_00 = (Tim_Man_t *)p->pManTime;
  if (p_00 == (Tim_Man_t *)0x0) {
    iVar11 = Gia_ManLutLevel(p,(int **)0x0);
    return iVar11;
  }
  Gia_ManCleanLevels(p,p->nObjs);
  Gia_ObjSetLevel(p,p->pObjs,0);
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  for (iVar11 = 0; iVar2 = Tim_ManPiNum(p_00), iVar11 < iVar2; iVar11 = iVar11 + 1) {
    pGVar7 = Gia_ManCi(p,iVar11);
    Gia_ObjSetLevel(p,pGVar7,0);
    Gia_ObjSetTravIdCurrent(p,pGVar7);
  }
  iVar11 = Tim_ManPiNum(p_00);
  iVar13 = 0;
  for (iVar2 = 0; iVar3 = Tim_ManBoxNum(p_00), iVar2 < iVar3; iVar2 = iVar2 + 1) {
    uVar4 = Tim_ManBoxInputNum(p_00,iVar2);
    uVar5 = Tim_ManBoxOutputNum(p_00,iVar2);
    pfVar8 = Tim_ManBoxDelayTable(p_00,iVar2);
    uVar1 = 0;
    iVar3 = iVar13;
    uVar14 = 0;
    if (0 < (int)uVar4) {
      uVar1 = uVar4;
      uVar14 = uVar4;
    }
    while (uVar1 != 0) {
      pGVar7 = Gia_ManCo(p,iVar3);
      iVar6 = Gia_ManLutLevelWithBoxes_rec
                        (p,pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff));
      if (iVar6 != 0) {
        puts("Boxes are not in a topological order. Switching to level computation without boxes.");
        iVar11 = Gia_ManLevelNum(p);
        return iVar11;
      }
      Gia_ObjSetCoLevel(p,pGVar7);
      uVar1 = uVar1 - 1;
      iVar3 = iVar3 + 1;
    }
    uVar10 = 0;
    if (0 < (int)uVar5) {
      uVar10 = (ulong)uVar5;
    }
    pfVar15 = pfVar8 + 3;
    for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
      pGVar7 = Gia_ManCi(p,iVar11 + (int)uVar9);
      Gia_ObjSetTravIdCurrent(p,pGVar7);
      if (uVar4 != (int)pfVar8[1]) {
        __assert_fail("nBoxInputs == (int)pDelayTable[1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                      ,0x275,"int Gia_ManLutLevelWithBoxes(Gia_Man_t *)");
      }
      uVar12 = 0;
      iVar3 = 0;
      while ((uVar14 != uVar12 &&
             (pObj = Gia_ManCo(p,iVar13 + (int)uVar12), pObj != (Gia_Obj_t *)0x0))) {
        if ((int)pfVar15[uVar12] != -1000000000) {
          iVar6 = Gia_ObjLevel(p,pObj);
          if (iVar3 <= iVar6 + 1) {
            iVar3 = iVar6 + 1;
          }
        }
        uVar12 = uVar12 + 1;
      }
      Gia_ObjSetLevel(p,pGVar7,iVar3);
      pfVar15 = pfVar15 + (int)uVar4;
    }
    iVar11 = uVar5 + iVar11;
    iVar13 = iVar13 + uVar4;
  }
  p->nLevels = 0;
  iVar2 = Tim_ManCoNum(p_00);
  iVar3 = Tim_ManPoNum(p_00);
  for (iVar2 = iVar2 - iVar3; iVar3 = Tim_ManCoNum(p_00), iVar2 < iVar3; iVar2 = iVar2 + 1) {
    pGVar7 = Gia_ManCo(p,iVar2);
    Gia_ManLutLevelWithBoxes_rec(p,pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff));
    Gia_ObjSetCoLevel(p,pGVar7);
    iVar3 = p->nLevels;
    iVar6 = Gia_ObjLevel(p,pGVar7);
    if (iVar6 < iVar3) {
      iVar6 = iVar3;
    }
    p->nLevels = iVar6;
  }
  iVar2 = Tim_ManPoNum(p_00);
  if (iVar11 != p->vCis->nSize) {
    __assert_fail("curCi == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x28b,"int Gia_ManLutLevelWithBoxes(Gia_Man_t *)");
  }
  if (iVar2 + iVar13 != p->vCos->nSize) {
    __assert_fail("curCo == Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x28c,"int Gia_ManLutLevelWithBoxes(Gia_Man_t *)");
  }
  return p->nLevels;
}

Assistant:

int Gia_ManLutLevelWithBoxes( Gia_Man_t * p )
{
//    int nAnd2Delay = p->nAnd2Delay ? p->nAnd2Delay : 1;
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Gia_Obj_t * pObj, * pObjIn;
    int i, k, j, curCi, curCo, LevelMax;
    assert( Gia_ManRegNum(p) == 0 );
    if ( pManTime == NULL )
        return Gia_ManLutLevel(p, NULL);
    // copy const and real PIs
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    Gia_ObjSetLevel( p, Gia_ManConst0(p), 0 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < Tim_ManPiNum(pManTime); i++ )
    {
        pObj = Gia_ManCi( p, i );
//        Gia_ObjSetLevel( p, pObj, Tim_ManGetCiArrival(pManTime, i) / nAnd2Delay );
        Gia_ObjSetLevel( p, pObj, 0 );
        Gia_ObjSetTravIdCurrent( p, pObj );
    }
    // create logic for each box
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < Tim_ManBoxNum(pManTime); i++ )
    {
        int nBoxInputs  = Tim_ManBoxInputNum( pManTime, i );
        int nBoxOutputs = Tim_ManBoxOutputNum( pManTime, i );
        float * pDelayTable = Tim_ManBoxDelayTable( pManTime, i );
        // compute level for TFI of box inputs
        for ( k = 0; k < nBoxInputs; k++ )
        {
            pObj = Gia_ManCo( p, curCo + k );
            if ( Gia_ManLutLevelWithBoxes_rec( p, Gia_ObjFanin0(pObj) ) )
            {
                printf( "Boxes are not in a topological order. Switching to level computation without boxes.\n" );
                return Gia_ManLevelNum( p );
            }
            // set box input level
            Gia_ObjSetCoLevel( p, pObj );
        }
        // compute level for box outputs
        for ( k = 0; k < nBoxOutputs; k++ )
        {
            pObj = Gia_ManCi( p, curCi + k );
            Gia_ObjSetTravIdCurrent( p, pObj );
            // evaluate delay of this output
            LevelMax = 0;
            assert( nBoxInputs == (int)pDelayTable[1] );
            for ( j = 0; j < nBoxInputs && (pObjIn = Gia_ManCo(p, curCo + j)); j++ )
                if ( (int)pDelayTable[3+k*nBoxInputs+j] != -ABC_INFINITY )
//                    LevelMax = Abc_MaxInt( LevelMax, Gia_ObjLevel(p, pObjIn) + ((int)pDelayTable[3+k*nBoxInputs+j] / nAnd2Delay) );
                    LevelMax = Abc_MaxInt( LevelMax, Gia_ObjLevel(p, pObjIn) + 1 );
            // set box output level
            Gia_ObjSetLevel( p, pObj, LevelMax );
        }
        curCo += nBoxInputs;
        curCi += nBoxOutputs;
    }
    // add remaining nodes
    p->nLevels = 0;
    for ( i = Tim_ManCoNum(pManTime) - Tim_ManPoNum(pManTime); i < Tim_ManCoNum(pManTime); i++ )
    {
        pObj = Gia_ManCo( p, i );
        Gia_ManLutLevelWithBoxes_rec( p, Gia_ObjFanin0(pObj) );
        Gia_ObjSetCoLevel( p, pObj );
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    curCo += Tim_ManPoNum(pManTime);
    // verify counts
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
//    printf( "Max level is %d.\n", p->nLevels );
    return p->nLevels;
}